

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O2

ValueType * anon_unknown.dwarf_83776::intToValue(ValueType *__return_storage_ptr__,int32_t value)

{
  allocator_type local_11;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,4,&local_11);
  *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
   _M_impl.super__Vector_impl_data._M_start = (uchar)value;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[1] = (uchar)((uint)value >> 8);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[2] = (uchar)((uint)value >> 0x10);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[3] = (uchar)((uint)value >> 0x18);
  return __return_storage_ptr__;
}

Assistant:

static core::ValueType intToValue(int32_t value) {
  std::vector<uint8_t> result(4);
  result[0] = (value >> 0) & 0xFF;
  result[1] = (value >> 8) & 0xFF;
  result[2] = (value >> 16) & 0xFF;
  result[3] = (value >> 24) & 0xFF;
  return result;
}